

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall
trompeloeil::list<trompeloeil::condition_base<int_&(int_&)>,_trompeloeil::delete_disposer>::~list
          (list<trompeloeil::condition_base<int_&(int_&)>,_trompeloeil::delete_disposer> *this)

{
  list_elem<trompeloeil::condition_base<int_&(int_&)>_> *plVar1;
  list_elem<trompeloeil::condition_base<int_&(int_&)>_> *plVar2;
  
  (this->super_list_elem<trompeloeil::condition_base<int_&(int_&)>_>)._vptr_list_elem =
       (_func_int **)&PTR__list_003ccfb8;
  plVar2 = (this->super_list_elem<trompeloeil::condition_base<int_&(int_&)>_>).next;
  while (plVar2 != &this->super_list_elem<trompeloeil::condition_base<int_&(int_&)>_>) {
    plVar1 = (list_elem<trompeloeil::condition_base<int_&(int_&)>_> *)&plVar2->_vptr_list_elem;
    plVar2 = plVar2->next;
    (*plVar1->_vptr_list_elem[1])();
  }
  (this->super_list_elem<trompeloeil::condition_base<int_&(int_&)>_>)._vptr_list_elem =
       (_func_int **)&PTR__list_elem_003cd030;
  plVar2 = (this->super_list_elem<trompeloeil::condition_base<int_&(int_&)>_>).next;
  plVar1 = (this->super_list_elem<trompeloeil::condition_base<int_&(int_&)>_>).prev;
  plVar2->prev = plVar1;
  plVar1->next = plVar2;
  (this->super_list_elem<trompeloeil::condition_base<int_&(int_&)>_>).next =
       &this->super_list_elem<trompeloeil::condition_base<int_&(int_&)>_>;
  (this->super_list_elem<trompeloeil::condition_base<int_&(int_&)>_>).prev =
       &this->super_list_elem<trompeloeil::condition_base<int_&(int_&)>_>;
  return;
}

Assistant:

list<T, Disposer>::~list()
  {
    auto i = this->begin();
    while (i != this->end())
    {
      auto& elem = *i;
      ++i; // intrusive list, so advance before destroying
      Disposer::dispose(&elem);
    }
  }